

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O3

iterator __thiscall
fmt::v10::
formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,2,2,0,2,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>const>const>,char,void>
::format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
          (formatter<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,2,2,0,2,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,2,0,2,2>const>const>,char,void>
           *this,CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                 *m,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  int _precision;
  appender __result;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ActualDstType actualDst;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  string local_440;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  *local_420;
  string local_418;
  string local_3f8;
  string local_3d8;
  __string_type str;
  IOFormat local_398;
  stringstream ss;
  ostream local_298 [112];
  ios_base local_228 [264];
  IOFormat format;
  
  local_468._8_8_ = local_468._0_8_;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  _precision = *(int *)this;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,", ","");
  local_468._0_8_ = &local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"\n","");
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"[","");
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_420 = m;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"]","");
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
  Eigen::IOFormat::IOFormat
            (&format,_precision,0,&str,(string *)local_468,&local_440,&local_3f8,&local_418,
             &local_3d8,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ != &local_458) {
    operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)local_420->m_lhs;
  str.field_2._M_allocated_capacity = (size_type)(local_420->m_rhs).m_functor.m_other;
  Eigen::IOFormat::IOFormat(&local_398,&format);
  auVar1._8_8_ = str.field_2._M_allocated_capacity;
  auVar1._0_8_ = str.field_2._0_8_;
  local_468 = divpd(*(undefined1 (*) [16])str._M_dataplus._M_p,auVar1);
  auVar2._8_8_ = str.field_2._M_allocated_capacity;
  auVar2._0_8_ = str.field_2._0_8_;
  local_458 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )divpd(*(undefined1 (*) [16])(str._M_dataplus._M_p + 0x10),auVar2);
  Eigen::internal::print_matrix<Eigen::Matrix<double,2,2,0,2,2>>
            (local_298,(Matrix<double,_2,_2,_0,_2,_2> *)local_468,&local_398);
  Eigen::IOFormat::~IOFormat(&local_398);
  __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  std::__cxx11::stringbuf::str();
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,fmt::v10::appender>
            (str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length,__result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  Eigen::IOFormat::~IOFormat(&format);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_228);
  return (iterator)
         (buffer<char> *)
         __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto format(const MATRIX& m, FormatContext& ctx) const {
    std::stringstream ss;  // NOLINT(misc-const-correctness)
    const Eigen::IOFormat format(precision, 0, ", ", "\n", "[", "]");
    ss << m.format(format);

    auto it = ctx.out();
    auto str = ss.str();
    std::copy(str.begin(), str.end(), it);
    return it;
  }